

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O2

void __thiscall
TPZTensor<double>::ComputeEigenvector0
          (TPZTensor<double> *this,double *eigenvalue,TPZManVector<double,_3> *eigenvector)

{
  double *pdVar1;
  double *pdVar2;
  char cVar3;
  double **ppdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  TPZManVector<double,_3> r0xr2;
  TPZManVector<double,_3> r0xr1;
  TPZManVector<double,_3> row2;
  TPZManVector<double,_3> row1;
  TPZManVector<double,_3> row0;
  TPZManVector<double,_3> r1xr2;
  
  TPZManVector<double,_3>::TPZManVector(&row0,3);
  pdVar1 = (this->fData).super_TPZVec<double>.fStore;
  *row0.super_TPZVec<double>.fStore = *pdVar1 - *eigenvalue;
  row0.super_TPZVec<double>.fStore[1] = pdVar1[1];
  row0.super_TPZVec<double>.fStore[2] = pdVar1[2];
  TPZManVector<double,_3>::TPZManVector(&row1,3);
  pdVar1 = (this->fData).super_TPZVec<double>.fStore;
  *row1.super_TPZVec<double>.fStore = pdVar1[1];
  row1.super_TPZVec<double>.fStore[1] = pdVar1[3] - *eigenvalue;
  row1.super_TPZVec<double>.fStore[2] = pdVar1[4];
  TPZManVector<double,_3>::TPZManVector(&row2,3);
  pdVar1 = (this->fData).super_TPZVec<double>.fStore;
  *row2.super_TPZVec<double>.fStore = pdVar1[2];
  row2.super_TPZVec<double>.fStore[1] = pdVar1[4];
  row2.super_TPZVec<double>.fStore[2] = pdVar1[5] - *eigenvalue;
  TPZManVector<double,_3>::TPZManVector(&r0xr1,3);
  Cross<double>(&row0.super_TPZVec<double>,&row1.super_TPZVec<double>,&r0xr1.super_TPZVec<double>);
  TPZManVector<double,_3>::TPZManVector(&r0xr2,3);
  Cross<double>(&row0.super_TPZVec<double>,&row2.super_TPZVec<double>,&r0xr2.super_TPZVec<double>);
  TPZManVector<double,_3>::TPZManVector(&r1xr2,3);
  Cross<double>(&row1.super_TPZVec<double>,&row2.super_TPZVec<double>,&r1xr2.super_TPZVec<double>);
  dVar5 = Dot<double>(&r0xr1.super_TPZVec<double>,&r0xr1.super_TPZVec<double>);
  dVar6 = Dot<double>(&r0xr2.super_TPZVec<double>,&r0xr2.super_TPZVec<double>);
  dVar7 = Dot<double>(&r1xr2.super_TPZVec<double>,&r1xr2.super_TPZVec<double>);
  dVar8 = dVar6;
  if (dVar6 <= dVar5) {
    dVar8 = dVar5;
  }
  cVar3 = '\x02';
  if (dVar7 <= dVar8) {
    cVar3 = dVar5 < dVar6;
  }
  if (cVar3 == '\0') {
    ppdVar4 = &r0xr1.super_TPZVec<double>.fStore;
  }
  else if (cVar3 == '\x01') {
    ppdVar4 = &r0xr2.super_TPZVec<double>.fStore;
    dVar5 = dVar6;
  }
  else {
    ppdVar4 = &r1xr2.super_TPZVec<double>.fStore;
    dVar5 = dVar7;
  }
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  dVar5 = 1.0 / dVar5;
  pdVar1 = *ppdVar4;
  pdVar2 = (eigenvector->super_TPZVec<double>).fStore;
  *pdVar2 = *pdVar1 * dVar5;
  pdVar2[1] = pdVar1[1] * dVar5;
  pdVar2[2] = dVar5 * pdVar1[2];
  TPZManVector<double,_3>::~TPZManVector(&r1xr2);
  TPZManVector<double,_3>::~TPZManVector(&r0xr2);
  TPZManVector<double,_3>::~TPZManVector(&r0xr1);
  TPZManVector<double,_3>::~TPZManVector(&row2);
  TPZManVector<double,_3>::~TPZManVector(&row1);
  TPZManVector<double,_3>::~TPZManVector(&row0);
  return;
}

Assistant:

void TPZTensor<T>::ComputeEigenvector0(const T &eigenvalue, TPZManVector<T, 3> &eigenvector) const {
    // Compute a unit-length eigenvector for eigenvalue[i0].  The matrix is
    // rank 2, so two of the rows are linearly independent.  For a robust
    // computation of the eigenvector, select the two rows whose cross product
    // has largest length of all pairs of rows.
    TPZManVector<T, 3> row0(3);
    row0[0] = XX() - eigenvalue;
    row0[1] = XY();
    row0[2] = XZ();
    TPZManVector<T, 3> row1(3);
    row1[0] = XY();
    row1[1] = YY() - eigenvalue;
    row1[2] = YZ();
    TPZManVector<T, 3> row2(3);
    row2[0] = XZ();
    row2[1] = YZ();
    row2[2] = ZZ() - eigenvalue;
    TPZManVector<T, 3> r0xr1(3);
    Cross(row0, row1, r0xr1);
    TPZManVector<T, 3> r0xr2(3);
    Cross(row0, row2, r0xr2);
    TPZManVector<T, 3> r1xr2(3);
    Cross(row1, row2, r1xr2);
    T d0 = Dot(r0xr1, r0xr1);
    T d1 = Dot(r0xr2, r0xr2);
    T d2 = Dot(r1xr2, r1xr2);

    REAL dmax = TPZExtractVal::val(d0);
    int imax = 0;
    if (TPZExtractVal::val(d1) > dmax) {
        dmax = TPZExtractVal::val(d1);
        imax = 1;
    }
    if (TPZExtractVal::val(d2) > dmax) {
        imax = 2;
    }

    if (imax == 0) {
        T inv_sqrt_val = 1. / sqrt(d0);
        eigenvector[0] = r0xr1[0] * inv_sqrt_val;
        eigenvector[1] = r0xr1[1] * inv_sqrt_val;
        eigenvector[2] = r0xr1[2] * inv_sqrt_val;
    } else if (imax == 1) {
        T inv_sqrt_val = 1. / sqrt(d1);
        eigenvector[0] = r0xr2[0] * inv_sqrt_val;
        eigenvector[1] = r0xr2[1] * inv_sqrt_val;
        eigenvector[2] = r0xr2[2] * inv_sqrt_val;
    } else {
        T inv_sqrt_val = 1. / sqrt(d2);
        eigenvector[0] = r1xr2[0] * inv_sqrt_val;
        eigenvector[1] = r1xr2[1] * inv_sqrt_val;
        eigenvector[2] = r1xr2[2] * inv_sqrt_val;
    }
}